

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void idx2::Resize<signed_char>(array<signed_char> *Array,i64 NewSize)

{
  char local_29;
  i64 local_28;
  i64 NewSize_local;
  array<signed_char> *Array_local;
  i64 local_10;
  
  local_28 = NewSize;
  NewSize_local = (i64)Array;
  if (Array->Capacity < NewSize) {
    GrowCapacity<signed_char>(Array,NewSize);
  }
  if (*(long *)(NewSize_local + 0x18) < local_28) {
    local_10 = NewSize_local;
    Array_local = (array<signed_char> *)NewSize_local;
    local_29 = '\0';
    Fill<signed_char*,signed_char>
              ((char *)(*(long *)NewSize_local + *(long *)(NewSize_local + 0x18)),
               (char *)(*(long *)NewSize_local + local_28),&local_29);
  }
  *(i64 *)(NewSize_local + 0x18) = local_28;
  return;
}

Assistant:

void
Resize(array<t>* Array, i64 NewSize)
{
  if (NewSize > Array->Capacity) // TODO: maybe grow the capacity until this is false
    GrowCapacity(Array, NewSize);
  if (Array->Size < NewSize)
    Fill(Begin(*Array) + Array->Size, Begin(*Array) + NewSize, t{});
  Array->Size = NewSize;
}